

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O1

int __thiscall
ncnn::Deconvolution::forward
          (Deconvolution *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  uint _c;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Mat *bottom_blob;
  pointer pMVar9;
  int *piVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  Deconvolution *this_00;
  void *pvVar13;
  Allocator **ppAVar14;
  int iVar15;
  void *pvVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  void *pvVar21;
  void *pvVar22;
  ulong uVar23;
  uint uVar24;
  undefined1 auVar25 [16];
  Mat local_188;
  pointer local_138;
  Deconvolution *local_130;
  ulong local_128;
  ulong local_120;
  Mat local_118;
  Mat local_c8;
  Mat local_78;
  
  bottom_blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
  pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = bottom_blob->c;
  local_120 = (ulong)(uint)bottom_blob[1].w;
  local_128 = (ulong)(uint)bottom_blob[1].h;
  _c = bottom_blob[1].d;
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8._20_8_ = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  local_130 = this;
  flatten(bottom_blob + 1,&local_c8,opt);
  iVar18 = -100;
  if ((local_c8.data == (void *)0x0) || ((long)local_c8.c * local_c8.cstep == 0)) goto LAB_0029addb;
  local_78.cstep = 0;
  uVar24 = (int)local_128 * (int)local_120;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  local_138 = pMVar9;
  Mat::create(&local_78,uVar1 * _c * uVar24,4,opt->workspace_allocator);
  iVar18 = -100;
  if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
    if (0 < (int)_c) {
      uVar17 = (ulong)uVar24;
      uVar20 = 0;
      pvVar13 = local_78.data;
      pvVar16 = local_c8.data;
      do {
        if (0 < (int)uVar1) {
          uVar19 = 0;
          pvVar21 = pvVar16;
          pvVar22 = pvVar13;
          do {
            if (0 < (int)uVar24) {
              uVar23 = 0;
              do {
                *(undefined4 *)((long)pvVar22 + uVar23 * 4) =
                     *(undefined4 *)((long)pvVar21 + uVar23 * 4);
                uVar23 = uVar23 + 1;
              } while (uVar17 != uVar23);
            }
            uVar19 = uVar19 + 1;
            pvVar22 = (void *)((long)pvVar22 + uVar17 * 4);
            pvVar21 = (void *)((long)pvVar21 + _c * uVar17 * 4);
          } while (uVar19 != uVar1);
        }
        uVar20 = uVar20 + 1;
        pvVar13 = (void *)((long)pvVar13 + uVar1 * uVar17 * 4);
        pvVar16 = (void *)((long)pvVar16 + uVar17 * 4);
      } while (uVar20 != _c);
    }
    local_118.cstep = 0;
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize._0_4_ = 0;
    local_118._20_8_ = 0;
    local_118.allocator = (Allocator *)0x0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
    if (local_130->bias_term == 0) {
LAB_0029aa1a:
      iVar18 = local_130->dilation_w;
      iVar2 = bottom_blob->w;
      iVar3 = local_130->stride_w;
      ppAVar14 = &opt->workspace_allocator;
      iVar4 = local_130->dilation_h;
      iVar5 = bottom_blob->h;
      iVar6 = local_130->stride_h;
      iVar7 = local_130->output_pad_right;
      iVar8 = local_130->output_pad_bottom;
      local_188.cstep = 0;
      local_188.data = (void *)0x0;
      local_188.refcount._0_4_ = 0;
      local_188.refcount._4_4_ = 0;
      local_188.elemsize._0_4_ = 0;
      local_188.elemsize._4_4_ = 0;
      local_188.elempack = 0;
      local_188.allocator = (Allocator *)0x0;
      local_188.dims = 0;
      local_188.w = 0;
      local_188.h = 0;
      local_188.d = 0;
      local_188.c = 0;
      auVar25._0_4_ = -(uint)(0 < local_130->pad_left);
      auVar25._4_4_ = -(uint)(0 < local_130->pad_right);
      auVar25._8_4_ = -(uint)(0 < local_130->pad_top);
      auVar25._12_4_ = -(uint)(0 < local_130->pad_bottom);
      iVar15 = movmskps((int)&local_188 + 0x28,auVar25);
      if ((iVar15 == 0) && ((local_130->output_w < 1 || (local_130->output_h < 1)))) {
        if (&local_188 != local_138) {
          piVar10 = local_138->refcount;
          if (piVar10 != (int *)0x0) {
            LOCK();
            *piVar10 = *piVar10 + 1;
            UNLOCK();
          }
          local_188.data = local_138->data;
          local_188.refcount._0_4_ = SUB84(local_138->refcount,0);
          local_188.refcount._4_4_ = (undefined4)((ulong)local_138->refcount >> 0x20);
          local_188.elemsize._0_4_ = (undefined4)local_138->elemsize;
          local_188.elemsize._4_4_ = (undefined4)(local_138->elemsize >> 0x20);
          local_188.elempack = local_138->elempack;
          local_188.allocator = local_138->allocator;
          uVar11 = local_138->dims;
          uVar12 = local_138->w;
          local_188.h = local_138->h;
          local_188.d = local_138->d;
          local_188.c = local_138->c;
          local_188.cstep = local_138->cstep;
          local_188.dims = uVar11;
          local_188.w = uVar12;
        }
        ppAVar14 = &opt->blob_allocator;
      }
      Mat::create(&local_188,iVar7 + ((int)local_120 + -1) * iVar18 + (iVar2 + -1) * iVar3 + 1,
                  iVar8 + 1 + ((int)local_128 + -1) * iVar4 + (iVar5 + -1) * iVar6,_c,4,*ppAVar14);
      this_00 = local_130;
      iVar18 = -100;
      if ((local_188.data != (void *)0x0) && ((long)local_188.c * local_188.cstep != 0)) {
        deconvolution(bottom_blob,&local_188,&local_78,&local_118,(int)local_120,(int)local_128,
                      local_130->stride_w,local_130->stride_h,local_130->dilation_w,
                      local_130->dilation_h,local_130->activation_type,&local_130->activation_params
                      ,(Option *)(ulong)(uint)local_130->stride_w);
        pMVar9 = local_138;
        cut_padding(this_00,&local_188,local_138,opt);
        if ((pMVar9->data != (void *)0x0) && (iVar18 = -100, (long)pMVar9->c * pMVar9->cstep != 0))
        {
          iVar18 = 0;
        }
      }
      piVar10 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_188.allocator == (Allocator *)0x0) {
            if (local_188.data != (void *)0x0) {
              free(local_188.data);
            }
          }
          else {
            (*(local_188.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_188.cstep = 0;
      local_188.data = (void *)0x0;
      local_188.refcount._0_4_ = 0;
      local_188.refcount._4_4_ = 0;
      local_188.elemsize._0_4_ = 0;
      local_188.elemsize._4_4_ = 0;
      local_188.elempack = 0;
      local_188.dims = 0;
      local_188.w = 0;
      local_188.h = 0;
      local_188.d = 0;
      local_188.c = 0;
    }
    else {
      flatten((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start + 2,&local_118,opt);
      iVar18 = -100;
      if ((local_118.data != (void *)0x0) && ((long)local_118.c * local_118.cstep != 0))
      goto LAB_0029aa1a;
    }
    piVar10 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          if (local_118.data != (void *)0x0) {
            free(local_118.data);
          }
        }
        else {
          (*(local_118.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_118.cstep = 0;
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize._0_4_ = 0;
    local_118._20_8_ = 0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
  }
  piVar10 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
LAB_0029addb:
  piVar10 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if (local_c8.data != (void *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar18;
}

Assistant:

int Deconvolution::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _num_input = bottom_blob.c;
    const int _kernel_w = _weight_data.w;
    const int _kernel_h = _weight_data.h;
    const int _num_output = _weight_data.d * 1;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    // transpose group-inch/group-outch/group-kh-kw to group-outch/group-inch/group-kh-kw
    Mat weight_data_transposed;
    {
        weight_data_transposed.create(_kernel_w * _kernel_h * _num_output * _num_input / 1, 4u, opt.workspace_allocator);
        if (weight_data_transposed.empty())
            return -100;

        const int outch_g = _num_output / 1;
        const int inch_g = _num_input / 1;
        const int maxk = _kernel_h * _kernel_w;

        for (int g = 0; g < 1; g++)
        {
            // reorder weight from inch-outch to outch-inch
            float* wg2 = (float*)weight_data_transposed + g * outch_g * inch_g * maxk;
            const float* wg = (const float*)weight_data_flattened + g * inch_g * outch_g * maxk;
            for (int i = 0; i < outch_g; i++)
            {
                for (int j = 0; j < inch_g; j++)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        wg2[(i * inch_g + j) * maxk + k] = wg[(j * outch_g + i) * maxk + k];
                    }
                }
            }
        }
    }

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;
    }

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;

    const int kernel_extent_w = dilation_w * (_kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (_kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, _num_output, 4u, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, _num_output, 4u, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolution(bottom_blob, top_blob_bordered, weight_data_transposed, bias_data_flattened, _kernel_w, _kernel_h, stride_w, stride_h, dilation_w, dilation_h, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}